

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  Instruction *pIVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  
  pcVar14 = (char *)0x0;
  uVar7 = (ulong)(uint)lastpc;
  do {
    iVar3 = (int)uVar7;
    pcVar4 = luaF_getlocalname(p,reg + 1,iVar3);
    *name = pcVar4;
    if (pcVar4 != (char *)0x0) {
      return "local";
    }
    if (iVar3 < 1) {
      return (char *)0x0;
    }
    pIVar1 = p->code;
    uVar6 = 0;
    uVar8 = 0xffffffff;
    iVar9 = 0;
    do {
      uVar5 = pIVar1[uVar6];
      uVar13 = uVar5 & 0x3f;
      uVar10 = uVar5 >> 6 & 0xff;
      if (uVar13 < 0x24) {
        if (uVar13 == 4) {
          if (((int)uVar10 <= reg) && ((uint)reg <= uVar10 + (uVar5 >> 0x17))) goto LAB_00109547;
        }
        else {
          if (uVar13 != 0x1e) goto LAB_00109538;
          iVar11 = (int)uVar6 + (uVar5 >> 0xe) + -0x1fffe;
          iVar12 = iVar9;
          if (iVar9 < iVar11) {
            iVar12 = iVar11;
          }
          if ((long)iVar11 <= (long)uVar6) {
            iVar12 = iVar9;
          }
          if (iVar11 <= iVar3) {
            iVar9 = iVar12;
          }
        }
      }
      else {
        if (1 < uVar13 - 0x24) {
          if (uVar13 != 0x29) {
LAB_00109538:
            if ((uVar10 == reg) && ((luaP_opmodes[uVar13] & 0x40) != 0)) goto LAB_00109547;
            goto LAB_00109556;
          }
          uVar10 = uVar10 + 2;
        }
        if ((int)uVar10 <= reg) {
LAB_00109547:
          uVar8 = 0xffffffff;
          if ((long)iVar9 <= (long)uVar6) {
            uVar8 = uVar6 & 0xffffffff;
          }
        }
      }
LAB_00109556:
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
    iVar3 = (int)uVar8;
    if (iVar3 == -1) {
      return (char *)0x0;
    }
    uVar5 = pIVar1[iVar3];
    uVar10 = uVar5 & 0x3f;
    if (uVar10 != 0) {
      pcVar14 = (char *)0x0;
      switch(uVar10) {
      case 1:
        uVar5 = uVar5 >> 0xe;
        break;
      case 2:
        uVar5 = pIVar1[(long)iVar3 + 1] >> 6;
        break;
      default:
        goto switchD_001095ad_caseD_3;
      case 5:
        lVar2 = *(long *)((long)&p->upvalues->name + (ulong)(uVar5 >> 0x13 & 0xfffffff0));
        pcVar14 = "?";
        if (lVar2 != 0) {
          pcVar14 = (char *)(lVar2 + 0x18);
        }
        *name = pcVar14;
        return "upvalue";
      case 6:
      case 7:
        uVar13 = uVar5 >> 0xe & 0x1ff;
        if (uVar10 == 7) {
          pcVar14 = luaF_getlocalname(p,(uVar5 >> 0x17) + 1,iVar3);
          kname(p,iVar3,uVar13,name);
          if (pcVar14 == (char *)0x0) {
            return "field";
          }
        }
        else {
          lVar2 = *(long *)((long)&p->upvalues->name + (ulong)((uVar5 >> 0x17) << 4));
          pcVar14 = "?";
          if (lVar2 != 0) {
            pcVar14 = (char *)(lVar2 + 0x18);
          }
          kname(p,iVar3,uVar13,name);
        }
        iVar3 = strcmp(pcVar14,"_ENV");
        if (iVar3 != 0) {
          return "field";
        }
        return "global";
      case 0xc:
        kname(p,iVar3,uVar5 >> 0xe & 0x1ff,name);
        pcVar14 = "method";
        goto switchD_001095ad_caseD_3;
      }
      if ((*(uint *)((long)&p->k->tt_ + (ulong)(uVar5 << 4)) & 0xf) == 4) {
        *name = (char *)(*(long *)((long)&p->k->value_ + (ulong)(uVar5 << 4)) + 0x18);
        return "constant";
      }
      return (char *)0x0;
    }
    reg = uVar5 >> 0x17;
    uVar7 = uVar8;
    if ((uVar5 >> 6 & 0xff) <= (uint)reg) {
switchD_001095ad_caseD_3:
      return pcVar14;
    }
  } while( true );
}

Assistant:

static const char *getobjname(Proto *p, int lastpc, int reg,
                              const char **name) {
    int pc;
    *name = luaF_getlocalname(p, reg + 1, lastpc);
    if (*name)  /* is a local? */
        return "local";
    /* else try symbolic execution */
    pc = findsetreg(p, lastpc, reg);
    if (pc != -1) {  /* could find instruction? */
        Instruction i = p->code[pc];
        OpCode op = GET_OPCODE(i);
        switch (op) {
            case OP_MOVE: {
                int b = GETARG_B(i);  /* move from 'b' to 'a' */
                if (b < GETARG_A(i))
                    return getobjname(p, pc, b, name);  /* get name for 'b' */
                break;
            }
            case OP_GETTABUP:
            case OP_GETTABLE: {
                int k = GETARG_C(i);  /* key index */
                int t = GETARG_B(i);  /* table index */
                const char *vn = (op == OP_GETTABLE)  /* name of indexed variable */
                                 ? luaF_getlocalname(p, t + 1, pc)
                                 : upvalname(p, t);
                kname(p, pc, k, name);
                return (vn && strcmp(vn, LUA_ENV) == 0) ? "global" : "field";
            }
            case OP_GETUPVAL: {
                *name = upvalname(p, GETARG_B(i));
                return "upvalue";
            }
            case OP_LOADK:
            case OP_LOADKX: {
                int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                         : GETARG_Ax(p->code[pc + 1]);
                if (ttisstring(&p->k[b])) {
                    *name = svalue(&p->k[b]);
                    return "constant";
                }
                break;
            }
            case OP_SELF: {
                int k = GETARG_C(i);  /* key index */
                kname(p, pc, k, name);
                return "method";
            }
            default:
                break;  /* go through to return NULL */
        }
    }
    return NULL;  /* could not find reasonable name */
}